

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackGenerator::InstallProjectViaInstalledDirectories
          (cmCPackGenerator *this,bool setDestDir,string *tempInstallDirectory,
          mode_t *default_dir_mode)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename;
  cmCPackLog *pcVar1;
  pointer pbVar2;
  pointer ppVar3;
  pointer pRVar4;
  bool bVar5;
  bool bVar6;
  char *pcVar7;
  ostream *poVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  pointer origName;
  pointer pbVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar10;
  int iVar11;
  string *this_00;
  pointer pbVar12;
  pointer this_01;
  string inFileRelative;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreFilesRegexString;
  int local_358;
  string destDir;
  string filePath;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  symlinkedFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installDirectoriesVector;
  string local_2b8;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> ignoreFilesRegex;
  string top;
  Glob gl;
  string subdir;
  ostringstream cmCPackLog_msg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [22];
  string findExpr;
  
  ignoreFilesRegex.
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ignoreFilesRegex.
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ignoreFilesRegex.
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_IGNORE_FILES",(allocator<char> *)&gl);
  pcVar7 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar7 != (char *)0x0) {
    ignoreFilesRegexString.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ignoreFilesRegexString.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ignoreFilesRegexString.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,pcVar7,(allocator<char> *)&gl);
    cmSystemTools::ExpandListArgument((string *)&cmCPackLog_msg,&ignoreFilesRegexString,false);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    pbVar9 = ignoreFilesRegexString.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar12 = ignoreFilesRegexString.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar9;
        pbVar12 = pbVar12 + 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar8 = std::operator<<((ostream *)&cmCPackLog_msg,"Create ignore files regex for: ");
      poVar8 = std::operator<<(poVar8,(string *)pbVar12);
      std::endl<char,std::char_traits<char>>(poVar8);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x13e,(char *)gl.Internals);
      std::__cxx11::string::~string((string *)&gl);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                 &ignoreFilesRegex,pbVar12);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ignoreFilesRegexString);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_INSTALLED_DIRECTORIES",(allocator<char> *)&gl);
  pcVar7 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  iVar11 = 1;
  if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
    installDirectoriesVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    installDirectoriesVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    installDirectoriesVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,pcVar7,(allocator<char> *)&gl);
    cmSystemTools::ExpandListArgument((string *)&cmCPackLog_msg,&installDirectoriesVector,false);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (((int)installDirectoriesVector.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
         (int)installDirectoriesVector.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start & 0x20U) == 0) {
      for (pbVar9 = installDirectoriesVector.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar9 != installDirectoriesVector.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 2) {
        symlinkedFiles.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        symlinkedFiles.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        symlinkedFiles.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar8 = std::operator<<((ostream *)&cmCPackLog_msg,"Find files");
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x156,(char *)gl.Internals);
        std::__cxx11::string::~string((string *)&gl);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        cmsys::Glob::Glob(&gl);
        std::__cxx11::string::string((string *)&top,(string *)pbVar9);
        std::__cxx11::string::string((string *)&subdir,(string *)(pbVar9 + 1));
        std::__cxx11::string::string((string *)&findExpr,(string *)&top);
        std::__cxx11::string::append((char *)&findExpr);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar8 = std::operator<<((ostream *)&cmCPackLog_msg,"- Install directory: ");
        poVar8 = std::operator<<(poVar8,(string *)&top);
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x15e,(char *)ignoreFilesRegexString.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::~string((string *)&ignoreFilesRegexString);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        gl.Recurse = true;
        gl.RecurseListDirs = true;
        bVar5 = cmsys::Glob::FindFiles(&gl,&findExpr,(GlobMessages *)0x0);
        if (!bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar8 = std::operator<<((ostream *)&cmCPackLog_msg,
                                   "Cannot find any files in the installed directory");
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x164,(char *)ignoreFilesRegexString.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
          std::__cxx11::string::~string((string *)&ignoreFilesRegexString);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
LAB_00144020:
          std::__cxx11::string::~string((string *)&findExpr);
          std::__cxx11::string::~string((string *)&subdir);
          std::__cxx11::string::~string((string *)&top);
          cmsys::Glob::~Glob(&gl);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&symlinkedFiles);
          goto LAB_00144061;
        }
        __x = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&this->files,__x);
        pbVar2 = (this->files).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        uVar10 = extraout_RDX;
        for (pbVar12 = (this->files).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar2;
            pbVar12 = pbVar12 + 1) {
          std::__cxx11::string::string((string *)&ignoreFilesRegexString,(string *)pbVar12);
          bVar5 = cmsys::SystemTools::FileIsDirectory(pbVar12);
          if (bVar5) {
            std::__cxx11::string::push_back((char)(cmWorkingDirectory *)&ignoreFilesRegexString);
          }
          pRVar4 = ignoreFilesRegex.
                   super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          bVar5 = false;
          for (this_01 = ignoreFilesRegex.
                         super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                         ._M_impl.super__Vector_impl_data._M_start; this_01 != pRVar4;
              this_01 = this_01 + 1) {
            bVar6 = cmsys::RegularExpression::find
                              (this_01,(char *)ignoreFilesRegexString.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
            if (bVar6) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
              poVar8 = std::operator<<((ostream *)&cmCPackLog_msg,"Ignore file: ");
              poVar8 = std::operator<<(poVar8,(string *)&ignoreFilesRegexString);
              std::endl<char,std::char_traits<char>>(poVar8);
              pcVar1 = this->Logger;
              std::__cxx11::stringbuf::str();
              cmCPackLog::Log(pcVar1,2,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x171,filePath._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&filePath);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
              bVar5 = true;
            }
          }
          if (bVar5) {
            std::__cxx11::string::~string((string *)&ignoreFilesRegexString);
            uVar10 = extraout_RDX_00;
          }
          else {
            std::__cxx11::string::string((string *)&filePath,(string *)tempInstallDirectory);
            std::operator+(&destDir,"/",&subdir);
            std::operator+(&inFileRelative,&destDir,"/");
            cmSystemTools::RelativePath(&local_2b8,&top,pbVar12);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &cmCPackLog_msg,&inFileRelative,&local_2b8);
            std::__cxx11::string::append((string *)&filePath);
            std::__cxx11::string::~string((string *)&cmCPackLog_msg);
            std::__cxx11::string::~string((string *)&local_2b8);
            std::__cxx11::string::~string((string *)&inFileRelative);
            std::__cxx11::string::~string((string *)&destDir);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
            poVar8 = std::operator<<((ostream *)&cmCPackLog_msg,"Copy file: ");
            poVar8 = std::operator<<(poVar8,(string *)&ignoreFilesRegexString);
            poVar8 = std::operator<<(poVar8," -> ");
            poVar8 = std::operator<<(poVar8,(string *)&filePath);
            std::endl<char,std::char_traits<char>>(poVar8);
            pcVar1 = this->Logger;
            std::__cxx11::stringbuf::str();
            cmCPackLog::Log(pcVar1,4,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x17c,inFileRelative._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&inFileRelative);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
            bVar5 = cmsys::SystemTools::FileIsSymlink((string *)&ignoreFilesRegexString);
            if (bVar5) {
              _cmCPackLog_msg = (pointer)local_1b8;
              local_1b8[0]._M_local_buf[0] = '\0';
              cmSystemTools::RelativePath(&inFileRelative,&top,(string *)&ignoreFilesRegexString);
              cmsys::SystemTools::ReadSymlink
                        ((string *)&ignoreFilesRegexString,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cmCPackLog_msg);
              std::
              vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              ::emplace_back<std::__cxx11::string,std::__cxx11::string>
                        ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                          *)&symlinkedFiles,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cmCPackLog_msg,&inFileRelative);
              std::__cxx11::string::~string((string *)&inFileRelative);
              std::__cxx11::string::~string((string *)&cmCPackLog_msg);
            }
            else {
              bVar5 = cmsys::SystemTools::CopyFileIfDifferent
                                ((string *)&ignoreFilesRegexString,&filePath);
              if ((!bVar5) ||
                 (bVar5 = cmFileTimes::Copy((string *)&ignoreFilesRegexString,&filePath), !bVar5)) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
                poVar8 = std::operator<<((ostream *)&cmCPackLog_msg,"Problem copying file: ");
                poVar8 = std::operator<<(poVar8,(string *)&ignoreFilesRegexString);
                poVar8 = std::operator<<(poVar8," -> ");
                poVar8 = std::operator<<(poVar8,(string *)&filePath);
                std::endl<char,std::char_traits<char>>(poVar8);
                pcVar1 = this->Logger;
                std::__cxx11::stringbuf::str();
                cmCPackLog::Log(pcVar1,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x18b,inFileRelative._M_dataplus._M_p);
                std::__cxx11::string::~string((string *)&inFileRelative);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
                std::__cxx11::string::~string((string *)&filePath);
                this_00 = (string *)&ignoreFilesRegexString;
                goto LAB_0014401b;
              }
            }
            std::__cxx11::string::~string((string *)&filePath);
            std::__cxx11::string::~string((string *)&ignoreFilesRegexString);
            uVar10 = extraout_RDX_01;
          }
        }
        if (symlinkedFiles.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            symlinkedFiles.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                    (&filePath,(SystemTools *)0x1,SUB81(uVar10,0));
          std::__cxx11::string::string((string *)&inFileRelative,(string *)tempInstallDirectory);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cmCPackLog_msg,"/",&subdir);
          std::__cxx11::string::append((string *)&inFileRelative);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar8 = std::operator<<((ostream *)&cmCPackLog_msg,"Change dir to: ");
          poVar8 = std::operator<<(poVar8,(string *)&inFileRelative);
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar1,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x195,(char *)ignoreFilesRegexString.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
          std::__cxx11::string::~string((string *)&ignoreFilesRegexString);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
          cmWorkingDirectory::cmWorkingDirectory
                    ((cmWorkingDirectory *)&ignoreFilesRegexString,&inFileRelative);
          ppVar3 = symlinkedFiles.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          origName = symlinkedFiles.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (local_358 != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
            poVar8 = std::operator<<((ostream *)&cmCPackLog_msg,
                                     "Failed to change working directory to ");
            poVar8 = std::operator<<(poVar8,(string *)&inFileRelative);
            poVar8 = std::operator<<(poVar8," : ");
            pcVar7 = strerror(local_358);
            poVar8 = std::operator<<(poVar8,pcVar7);
            std::endl<char,std::char_traits<char>>(poVar8);
            pcVar1 = this->Logger;
            std::__cxx11::stringbuf::str();
            cmCPackLog::Log(pcVar1,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x19c,destDir._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&destDir);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
LAB_00143fff:
            cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)&ignoreFilesRegexString);
            std::__cxx11::string::~string((string *)&inFileRelative);
            this_00 = &filePath;
LAB_0014401b:
            std::__cxx11::string::~string((string *)this_00);
            goto LAB_00144020;
          }
          for (; origName != ppVar3; origName = origName + 1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
            poVar8 = std::operator<<((ostream *)&cmCPackLog_msg,"Will create a symlink: ");
            filename = &origName->second;
            poVar8 = std::operator<<(poVar8,(string *)filename);
            poVar8 = std::operator<<(poVar8,"--> ");
            poVar8 = std::operator<<(poVar8,(string *)origName);
            std::endl<char,std::char_traits<char>>(poVar8);
            pcVar1 = this->Logger;
            std::__cxx11::stringbuf::str();
            cmCPackLog::Log(pcVar1,4,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x1a3,destDir._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&destDir);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
            cmsys::SystemTools::GetFilenamePath(&destDir,filename);
            if ((destDir._M_string_length != 0) &&
               (bVar5 = cmsys::SystemTools::MakeDirectory(&destDir,default_dir_mode), !bVar5)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
              poVar8 = std::operator<<((ostream *)&cmCPackLog_msg,"Cannot create dir: ");
              poVar8 = std::operator<<(poVar8,(string *)&destDir);
              poVar8 = std::operator<<(poVar8,"\nTrying to create symlink: ");
              poVar8 = std::operator<<(poVar8,(string *)filename);
              poVar8 = std::operator<<(poVar8,"--> ");
              poVar8 = std::operator<<(poVar8,(string *)origName);
              std::endl<char,std::char_traits<char>>(poVar8);
              pcVar1 = this->Logger;
              std::__cxx11::stringbuf::str();
              cmCPackLog::Log(pcVar1,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x1ad,local_2b8._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&local_2b8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
            }
            bVar5 = cmSystemTools::CreateSymlink(&origName->first,filename,(string *)0x0);
            if (!bVar5) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
              poVar8 = std::operator<<((ostream *)&cmCPackLog_msg,"Cannot create symlink: ");
              poVar8 = std::operator<<(poVar8,(string *)filename);
              poVar8 = std::operator<<(poVar8,"--> ");
              poVar8 = std::operator<<(poVar8,(string *)origName);
              std::endl<char,std::char_traits<char>>(poVar8);
              pcVar1 = this->Logger;
              std::__cxx11::stringbuf::str();
              cmCPackLog::Log(pcVar1,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x1b4,local_2b8._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&local_2b8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
              std::__cxx11::string::~string((string *)&destDir);
              goto LAB_00143fff;
            }
            std::__cxx11::string::~string((string *)&destDir);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar8 = std::operator<<((ostream *)&cmCPackLog_msg,"Going back to: ");
          poVar8 = std::operator<<(poVar8,(string *)&filePath);
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar1,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x1b9,destDir._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&destDir);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
          cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)&ignoreFilesRegexString);
          std::__cxx11::string::~string((string *)&inFileRelative);
          std::__cxx11::string::~string((string *)&filePath);
        }
        std::__cxx11::string::~string((string *)&findExpr);
        std::__cxx11::string::~string((string *)&subdir);
        std::__cxx11::string::~string((string *)&top);
        cmsys::Glob::~Glob(&gl);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&symlinkedFiles);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&installDirectoriesVector);
      iVar11 = 1;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar8 = std::operator<<((ostream *)&cmCPackLog_msg,
                               "CPACK_INSTALLED_DIRECTORIES should contain pairs of <directory> and <subdirectory>. The <subdirectory> can be \'.\' to be installed in the toplevel directory of installation."
                              );
      std::endl<char,std::char_traits<char>>(poVar8);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x14e,(char *)gl.Internals);
      std::__cxx11::string::~string((string *)&gl);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
LAB_00144061:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&installDirectoriesVector);
      iVar11 = 0;
    }
  }
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::~vector
            (&ignoreFilesRegex);
  return iVar11;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstalledDirectories(
  bool setDestDir, const std::string& tempInstallDirectory,
  const mode_t* default_dir_mode)
{
  (void)setDestDir;
  (void)tempInstallDirectory;
  std::vector<cmsys::RegularExpression> ignoreFilesRegex;
  const char* cpackIgnoreFiles = this->GetOption("CPACK_IGNORE_FILES");
  if (cpackIgnoreFiles) {
    std::vector<std::string> ignoreFilesRegexString;
    cmSystemTools::ExpandListArgument(cpackIgnoreFiles,
                                      ignoreFilesRegexString);
    for (std::string const& ifr : ignoreFilesRegexString) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Create ignore files regex for: " << ifr << std::endl);
      ignoreFilesRegex.emplace_back(ifr);
    }
  }
  const char* installDirectories =
    this->GetOption("CPACK_INSTALLED_DIRECTORIES");
  if (installDirectories && *installDirectories) {
    std::vector<std::string> installDirectoriesVector;
    cmSystemTools::ExpandListArgument(installDirectories,
                                      installDirectoriesVector);
    if (installDirectoriesVector.size() % 2 != 0) {
      cmCPackLogger(
        cmCPackLog::LOG_ERROR,
        "CPACK_INSTALLED_DIRECTORIES should contain pairs of <directory> and "
        "<subdirectory>. The <subdirectory> can be '.' to be installed in "
        "the toplevel directory of installation."
          << std::endl);
      return 0;
    }
    std::vector<std::string>::iterator it;
    const std::string& tempDir = tempInstallDirectory;
    for (it = installDirectoriesVector.begin();
         it != installDirectoriesVector.end(); ++it) {
      std::vector<std::pair<std::string, std::string>> symlinkedFiles;
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "Find files" << std::endl);
      cmsys::Glob gl;
      std::string top = *it;
      it++;
      std::string subdir = *it;
      std::string findExpr = top;
      findExpr += "/*";
      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                    "- Install directory: " << top << std::endl);
      gl.RecurseOn();
      gl.SetRecurseListDirs(true);
      if (!gl.FindFiles(findExpr)) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Cannot find any files in the installed directory"
                        << std::endl);
        return 0;
      }
      files = gl.GetFiles();
      for (std::string const& gf : files) {
        bool skip = false;
        std::string inFile = gf;
        if (cmSystemTools::FileIsDirectory(gf)) {
          inFile += '/';
        }
        for (cmsys::RegularExpression& reg : ignoreFilesRegex) {
          if (reg.find(inFile)) {
            cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                          "Ignore file: " << inFile << std::endl);
            skip = true;
          }
        }
        if (skip) {
          continue;
        }
        std::string filePath = tempDir;
        filePath += "/" + subdir + "/" + cmSystemTools::RelativePath(top, gf);
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "Copy file: " << inFile << " -> " << filePath
                                    << std::endl);
        /* If the file is a symlink we will have to re-create it */
        if (cmSystemTools::FileIsSymlink(inFile)) {
          std::string targetFile;
          std::string inFileRelative =
            cmSystemTools::RelativePath(top, inFile);
          cmSystemTools::ReadSymlink(inFile, targetFile);
          symlinkedFiles.emplace_back(std::move(targetFile),
                                      std::move(inFileRelative));
        }
        /* If it is not a symlink then do a plain copy */
        else if (!(cmSystemTools::CopyFileIfDifferent(inFile, filePath) &&
                   cmFileTimes::Copy(inFile, filePath))) {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "Problem copying file: " << inFile << " -> "
                                                 << filePath << std::endl);
          return 0;
        }
      }
      /* rebuild symlinks in the installed tree */
      if (!symlinkedFiles.empty()) {
        std::string curDir = cmSystemTools::GetCurrentWorkingDirectory();
        std::string goToDir = tempDir;
        goToDir += "/" + subdir;
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "Change dir to: " << goToDir << std::endl);
        cmWorkingDirectory workdir(goToDir);
        if (workdir.Failed()) {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "Failed to change working directory to "
                          << goToDir << " : "
                          << std::strerror(workdir.GetLastResult())
                          << std::endl);
          return 0;
        }
        for (auto const& symlinked : symlinkedFiles) {
          cmCPackLogger(cmCPackLog::LOG_DEBUG,
                        "Will create a symlink: " << symlinked.second << "--> "
                                                  << symlinked.first
                                                  << std::endl);
          // make sure directory exists for symlink
          std::string destDir =
            cmSystemTools::GetFilenamePath(symlinked.second);
          if (!destDir.empty() &&
              !cmSystemTools::MakeDirectory(destDir, default_dir_mode)) {
            cmCPackLogger(cmCPackLog::LOG_ERROR,
                          "Cannot create dir: "
                            << destDir << "\nTrying to create symlink: "
                            << symlinked.second << "--> " << symlinked.first
                            << std::endl);
          }
          if (!cmSystemTools::CreateSymlink(symlinked.first,
                                            symlinked.second)) {
            cmCPackLogger(cmCPackLog::LOG_ERROR,
                          "Cannot create symlink: "
                            << symlinked.second << "--> " << symlinked.first
                            << std::endl);
            return 0;
          }
        }
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "Going back to: " << curDir << std::endl);
      }
    }
  }
  return 1;
}